

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cross_entropy_loss.cc
# Opt level: O0

void xLearn::ce_evalute_thread
               (vector<float,_std::allocator<float>_> *pred,
               vector<float,_std::allocator<float>_> *label,real_t *tmp_sum,size_t start_idx,
               size_t end_idx)

{
  float fVar1;
  ostream *poVar2;
  const_reference pvVar3;
  ulong in_RCX;
  float *in_RDX;
  vector<float,_std::allocator<float>_> *in_RSI;
  vector<float,_std::allocator<float>_> *in_RDI;
  ulong in_R8;
  double dVar4;
  real_t y;
  size_t i;
  Logger *in_stack_fffffffffffffee0;
  string *in_stack_ffffffffffffff48;
  allocator *paVar5;
  string *file;
  LogSeverity in_stack_ffffffffffffff64;
  ulong local_98;
  allocator local_89;
  string local_88 [55];
  undefined1 local_51 [37];
  Logger local_2c;
  ulong local_28;
  ulong local_20;
  float *local_18;
  vector<float,_std::allocator<float>_> *local_10;
  vector<float,_std::allocator<float>_> *local_8;
  
  local_28 = in_R8;
  if (in_R8 < in_RCX) {
    local_20 = in_RCX;
    Logger::Logger(&local_2c,ERR);
    file = (string *)local_51;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_51 + 1),
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/cross_entropy_loss.cc"
               ,(allocator *)file);
    paVar5 = &local_89;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"ce_evalute_thread",paVar5);
    poVar2 = Logger::Start(in_stack_ffffffffffffff64,file,(int)((ulong)paVar5 >> 0x20),
                           in_stack_ffffffffffffff48);
    poVar2 = std::operator<<(poVar2,"CHECK_GE failed ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/cross_entropy_loss.cc"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x22);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"end_idx");
    poVar2 = std::operator<<(poVar2," = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_28);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"start_idx");
    poVar2 = std::operator<<(poVar2," = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_20);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    std::__cxx11::string::~string((string *)(local_51 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_51);
    Logger::~Logger(in_stack_fffffffffffffee0);
    abort();
  }
  *in_RDX = 0.0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_98 = in_RCX; local_98 < local_28; local_98 = local_98 + 1) {
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](local_10,local_98);
    fVar1 = 1.0;
    if (*pvVar3 <= 0.0) {
      fVar1 = -1.0;
    }
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](local_8,local_98);
    dVar4 = std::exp((double)(ulong)(uint)(-fVar1 * *pvVar3));
    dVar4 = std::log1p(dVar4);
    *local_18 = SUB84(dVar4,0) + *local_18;
  }
  return;
}

Assistant:

static void ce_evalute_thread(const std::vector<real_t>* pred,
                              const std::vector<real_t>* label,
                              real_t* tmp_sum,
                              size_t start_idx,
                              size_t end_idx) {
  CHECK_GE(end_idx, start_idx);
  *tmp_sum = 0;
  for (size_t i = start_idx; i < end_idx; ++i) {
    real_t y = (*label)[i] > 0 ? 1.0 : -1.0;
    (*tmp_sum) += log1p(exp(-y*(*pred)[i]));
  }
}